

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(SerialArena *this,size_t n)

{
  bool bVar1;
  char **v1;
  char **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  SerialArena *local_70;
  void *ptr;
  Voidify local_51;
  char *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_38;
  Voidify local_21;
  size_t local_20;
  size_t n_local;
  SerialArena *this_local;
  
  local_20 = n;
  n_local = (size_t)this;
  bVar1 = ArenaAlignDefault::IsAligned(n);
  absl_log_internal_check_op_result._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
               ,0x75,"internal::ArenaAlignDefault::IsAligned(n)");
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&this->limit_);
  local_50 = SerialArena::ptr(this);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&local_50);
  local_48 = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>(v1,v2,"limit_ >= ptr()");
  if (local_48 == (Nullable<const_char_*>)0x0) {
    bVar1 = MaybeAllocateAligned(this,local_20,&local_70);
    if (bVar1) {
      this_local = local_70;
    }
    else {
      this_local = (SerialArena *)AllocateAlignedFallback(this,local_20);
    }
    return this_local;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&ptr,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,0x76,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&ptr);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (ABSL_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }